

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O1

object * borg_get_top_object(chunk_conflict1 *c,loc grid)

{
  object *poVar1;
  
  poVar1 = square_object(cave,grid);
  while ((poVar1 != (object *)0x0 &&
         (((poVar1->known != (object *)0x0 && ((poVar1->known->notice & 4) != 0)) ||
          (poVar1->kind->ignore != '\0'))))) {
    poVar1 = poVar1->next;
  }
  return poVar1;
}

Assistant:

struct object * borg_get_top_object(struct chunk *c, struct loc grid)
{
    /* Cheat the Actual item */
    struct object *o_ptr;
    o_ptr = square_object(cave, grid);
    while (o_ptr) {
        if ((o_ptr->known && o_ptr->known->notice & OBJ_NOTICE_IGNORE))
            o_ptr = o_ptr->next;
        else if (o_ptr->kind->ignore)
            o_ptr = o_ptr->next;
        else
            break;
    }

    return o_ptr;
}